

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordEncoder.cc
# Opt level: O1

vector<onmt::Token,_std::allocator<onmt::Token>_> * __thiscall
onmt::SubwordEncoder::encode_and_annotate
          (vector<onmt::Token,_std::allocator<onmt::Token>_> *__return_storage_ptr__,
          SubwordEncoder *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,
          bool training)

{
  pointer pTVar1;
  bool bVar2;
  pointer this_00;
  vector<onmt::Token,_std::allocator<onmt::Token>_> sub_segments;
  vector<onmt::Token,_std::allocator<onmt::Token>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
            (__return_storage_ptr__,
             ((long)(tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x1c71c71c71c71c72);
  this_00 = (tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pTVar1) {
    do {
      bVar2 = Token::is_placeholder(this_00);
      if (bVar2) {
        std::vector<onmt::Token,_std::allocator<onmt::Token>_>::push_back
                  (__return_storage_ptr__,this_00);
      }
      else {
        (*this->_vptr_SubwordEncoder[7])(&local_48,this,this_00,(ulong)training);
        std::vector<onmt::Token,std::allocator<onmt::Token>>::
        _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<onmt::Token*,std::vector<onmt::Token,std::allocator<onmt::Token>>>>>
                  ((vector<onmt::Token,std::allocator<onmt::Token>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(&local_48);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> SubwordEncoder::encode_and_annotate(const std::vector<Token>& tokens,
                                                         bool training) const
  {
    std::vector<Token> segments;
    segments.reserve(tokens.size() * 2);

    for (const auto& token : tokens)
    {
      if (token.is_placeholder()) {
        segments.push_back(token);
        continue;
      }

      std::vector<Token> sub_segments = encode_and_annotate(token, training);
      segments.insert(segments.end(),
                      std::make_move_iterator(sub_segments.begin()),
                      std::make_move_iterator(sub_segments.end()));
    }

    return segments;
  }